

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O0

void __thiscall SMBusAnalyzer::SetupResults(SMBusAnalyzer *this)

{
  SMBusAnalyzerResults *this_00;
  element_type *peVar1;
  SMBusAnalyzer *this_local;
  
  this_00 = (SMBusAnalyzerResults *)operator_new(0x20);
  SMBusAnalyzerResults::SMBusAnalyzerResults(this_00,this,&this->mSettings);
  std::auto_ptr<SMBusAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<SMBusAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<SMBusAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  peVar1 = std::auto_ptr<SMBusAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void SMBusAnalyzer::SetupResults()
{
    // reset the results
    mResults.reset( new SMBusAnalyzerResults( this, &mSettings ) );
    SetAnalyzerResults( mResults.get() );

    // set which channels will carry bubbles
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSMBDAT );
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSMBCLK );
}